

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void print_element_escaped(Elem *ee,int double_escaped)

{
  int double_escaped_local;
  Elem *ee_local;
  
  if (ee->kind == ELEM_TERM) {
    print_term_escaped((ee->e).term,double_escaped);
  }
  else if (ee->kind == ELEM_UNRESOLVED) {
    printf("%s ",(ee->e).nterm);
  }
  else {
    printf("%s ",((ee->e).nterm)->name);
  }
  return;
}

Assistant:

static void print_element_escaped(Elem *ee, int double_escaped) {
  if (ee->kind == ELEM_TERM)
    print_term_escaped(ee->e.term, double_escaped);
  else if (ee->kind == ELEM_UNRESOLVED)
    printf("%s ", ee->e.unresolved.string);
  else
    printf("%s ", ee->e.nterm->name);
}